

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void __thiscall leveldb::log::_Test_OpenForAppend::_Run(_Test_OpenForAppend *this)

{
  string sStack_1c8;
  Tester local_1a8;
  
  std::__cxx11::string::string((string *)&local_1a8,"hello",(allocator *)&sStack_1c8);
  LogTest::Write(&this->super_LogTest,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  LogTest::ReopenForAppend(&this->super_LogTest);
  std::__cxx11::string::string((string *)&local_1a8,"world",(allocator *)&sStack_1c8);
  LogTest::Write(&this->super_LogTest,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x15a);
  LogTest::Read_abi_cxx11_(&sStack_1c8,&this->super_LogTest);
  test::Tester::IsEq<char[6],std::__cxx11::string>(&local_1a8,(char (*) [6])"hello",&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  test::Tester::~Tester(&local_1a8);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x15b);
  LogTest::Read_abi_cxx11_(&sStack_1c8,&this->super_LogTest);
  test::Tester::IsEq<char[6],std::__cxx11::string>(&local_1a8,(char (*) [6])"world",&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  test::Tester::~Tester(&local_1a8);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x15c);
  LogTest::Read_abi_cxx11_(&sStack_1c8,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>(&local_1a8,(char (*) [4])"EOF",&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  test::Tester::~Tester(&local_1a8);
  return;
}

Assistant:

TEST(LogTest, OpenForAppend) {
  Write("hello");
  ReopenForAppend();
  Write("world");
  ASSERT_EQ("hello", Read());
  ASSERT_EQ("world", Read());
  ASSERT_EQ("EOF", Read());
}